

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_yplus_metric
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs,
          REF_BOOL sample_viscous_length_error)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar4;
  REF_INT *pRVar5;
  bool bVar6;
  double dVar7;
  REF_EDGE ref_edge;
  int iVar8;
  REF_STATUS RVar9;
  REF_BOOL RVar10;
  uint uVar11;
  REF_INT *vector;
  long lVar12;
  REF_DBL *vector_00;
  undefined4 extraout_var;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  REF_DBL *pRVar16;
  REF_INT cell;
  char *pcVar17;
  long lVar18;
  uint unaff_R14D;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  REF_INT bc;
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  uint local_1e8;
  REF_DBL *local_1d8;
  REF_DBL *local_1c0;
  REF_INT local_1b4;
  REF_DBL *local_1b0;
  REF_BOOL local_1a4;
  REF_DBL local_1a0;
  REF_DBL local_198;
  REF_DBL local_190;
  double local_188;
  double local_180;
  double local_178;
  REF_DICT local_170;
  double local_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  local_1a4 = sample_viscous_length_error;
  local_1a0 = target;
  local_198 = mach;
  local_190 = re;
  local_170 = ref_dict_bcs;
  if ((long)ref_node->max < 0) {
    local_1e8 = 1;
    pcVar17 = "malloc hits of REF_INT negative";
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node->max << 2);
    if (vector != (REF_INT *)0x0) {
      bVar6 = true;
      local_1e8 = unaff_R14D;
      if (0 < ref_node->max) {
        lVar12 = 0;
        do {
          vector[lVar12] = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < ref_node->max);
      }
      goto LAB_001bc56e;
    }
    local_1e8 = 2;
    pcVar17 = "malloc hits of REF_INT NULL";
  }
  bVar6 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x40e,
         "ref_phys_yplus_metric",pcVar17);
  vector = (REF_INT *)0x0;
LAB_001bc56e:
  if (bVar6) {
    uVar11 = ref_node->max;
    local_1b0 = metric;
    if ((int)uVar11 < 0) {
      bVar6 = false;
      iVar8 = printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x40f,"ref_phys_yplus_metric","malloc new_log_metric of REF_DBL negative");
      vector_00 = (REF_DBL *)CONCAT44(extraout_var,iVar8);
      uVar14 = 1;
    }
    else {
      vector_00 = (REF_DBL *)malloc((ulong)uVar11 * 0x30);
      if (vector_00 == (REF_DBL *)0x0) {
        bVar6 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x40f,"ref_phys_yplus_metric","malloc new_log_metric of REF_DBL NULL");
        vector_00 = (REF_DBL *)0x0;
        uVar14 = 2;
      }
      else {
        bVar6 = true;
        uVar14 = local_1e8;
        if ((ulong)uVar11 != 0) {
          uVar15 = 1;
          if (1 < (int)(uVar11 * 6)) {
            uVar15 = (ulong)(uVar11 * 6);
          }
          memset(vector_00,0,uVar15 << 3);
        }
      }
    }
    local_1e8 = uVar14;
    if (bVar6) {
      iVar8 = ref_node->max;
      if ((long)iVar8 < 0) {
        bVar6 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x410,"ref_phys_yplus_metric","malloc lengthscale of REF_DBL negative");
        uVar14 = 1;
      }
      else {
        sVar1 = (long)iVar8 * 8;
        local_1d8 = (REF_DBL *)malloc(sVar1);
        if (local_1d8 == (REF_DBL *)0x0) {
          bVar6 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x410,"ref_phys_yplus_metric","malloc lengthscale of REF_DBL NULL");
          uVar14 = 2;
          local_1d8 = (REF_DBL *)0x0;
        }
        else {
          bVar6 = true;
          if (iVar8 != 0) {
            memset(local_1d8,0,sVar1);
          }
        }
      }
      local_1e8 = uVar14;
      if (bVar6) {
        iVar8 = ref_node->max;
        if ((long)iVar8 < 0) {
          bVar6 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x411,"ref_phys_yplus_metric","malloc lengthscale2 of REF_DBL negative");
          uVar14 = 1;
        }
        else {
          sVar1 = (long)iVar8 * 8;
          local_1c0 = (REF_DBL *)malloc(sVar1);
          if (local_1c0 == (REF_DBL *)0x0) {
            bVar6 = false;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x411,"ref_phys_yplus_metric","malloc lengthscale2 of REF_DBL NULL");
            uVar14 = 2;
            local_1c0 = (REF_DBL *)0x0;
          }
          else {
            bVar6 = true;
            if (iVar8 != 0) {
              memset(local_1c0,0,sVar1);
            }
          }
        }
        local_1e8 = uVar14;
        if (bVar6) {
          local_1e8 = ref_phys_yplus_lengthscale
                                (ref_grid,local_198,local_190,temperature,ldim,field,local_1d8);
          if (local_1e8 == 0) {
            local_1e8 = ref_phys_yplus_lengthscale2
                                  (ref_grid,local_198,local_190,temperature,ldim,field,local_1c0);
            if (local_1e8 == 0) {
              if (ref_grid->twod == 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x45a,"ref_phys_yplus_metric",6,"implement 3D");
                local_1e8 = 6;
              }
              else {
                ref_cell = ref_grid->cell[0];
                bVar6 = 0 < ref_cell->max;
                local_1e8 = uVar14;
                if (0 < ref_cell->max) {
                  cell = 0;
                  do {
                    RVar9 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_108);
                    if (RVar9 == 0) {
                      local_1b4 = -1;
                      uVar11 = ref_dict_value(local_170,
                                              *(REF_INT *)
                                               ((long)&local_108 + (long)ref_cell->node_per * 4),
                                              &local_1b4);
                      if ((uVar11 != 0) && (uVar11 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x426,"ref_phys_yplus_metric",(ulong)uVar11,"bc");
                        local_1e8 = uVar11;
                      }
                      if ((uVar11 != 5) && (uVar11 != 0)) break;
                      RVar10 = ref_phys_wall_distance_bc(local_1b4);
                      if (RVar10 != 0) {
                        uVar11 = ref_layer_interior_seg_normal(ref_grid,cell,&local_188);
                        pRVar16 = local_1b0;
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x428,"ref_phys_yplus_metric",(ulong)uVar11,"edge norm");
                          local_1e8 = uVar11;
                          break;
                        }
                        local_150 = local_188;
                        local_148 = local_180;
                        local_140 = local_178;
                        lVar12 = (long)(int)local_108;
                        dVar22 = (local_1b0[lVar12 * 6 + 5] * local_178 +
                                 local_1b0[lVar12 * 6 + 2] * local_188 +
                                 local_180 * local_1b0[lVar12 * 6 + 4]) * local_178 +
                                 (local_1b0[lVar12 * 6 + 2] * local_178 +
                                 local_1b0[lVar12 * 6] * local_188 +
                                 local_180 * local_1b0[lVar12 * 6 + 1]) * local_188 +
                                 (local_1b0[lVar12 * 6 + 4] * local_178 +
                                 local_1b0[lVar12 * 6 + 1] * local_188 +
                                 local_1b0[lVar12 * 6 + 3] * local_180) * local_180;
                        if (dVar22 < 0.0) {
                          dVar22 = sqrt(dVar22);
                        }
                        else {
                          dVar22 = SQRT(dVar22);
                        }
                        lVar12 = (long)local_108._4_4_;
                        dVar7 = (pRVar16[lVar12 * 6 + 5] * local_178 +
                                pRVar16[lVar12 * 6 + 2] * local_188 +
                                local_180 * pRVar16[lVar12 * 6 + 4]) * local_178 +
                                (pRVar16[lVar12 * 6 + 2] * local_178 +
                                pRVar16[lVar12 * 6] * local_188 +
                                pRVar16[lVar12 * 6 + 1] * local_180) * local_188 +
                                (pRVar16[lVar12 * 6 + 4] * local_178 +
                                pRVar16[lVar12 * 6 + 1] * local_188 +
                                pRVar16[lVar12 * 6 + 3] * local_180) * local_180;
                        if (dVar7 < 0.0) {
                          dVar7 = sqrt(dVar7);
                        }
                        else {
                          dVar7 = SQRT(dVar7);
                        }
                        lVar12 = (long)(int)local_108;
                        lVar13 = (long)local_108._4_4_;
                        dVar19 = (local_1d8[lVar12] + local_1d8[lVar13]) * 0.5;
                        dVar20 = (local_1c0[lVar12] + local_1c0[lVar13]) * 0.5 - dVar19;
                        if (dVar20 <= -dVar20) {
                          dVar20 = -dVar20;
                        }
                        dVar20 = dVar20 / dVar19 + -0.1;
                        if (dVar20 <= 0.0) {
                          dVar20 = 0.0;
                        }
                        dVar20 = dVar20 / 0.1;
                        if (1.0 <= dVar20) {
                          dVar20 = 1.0;
                        }
                        dVar21 = (dVar19 * local_1a0) / 0.866025403784439;
                        if (local_1a4 != 0) {
                          dVar21 = dVar20 * (1.0 / ((dVar22 + dVar7) * 0.5)) +
                                   ((1.0 - dVar20) * local_1a0 * dVar19) / 0.866025403784439;
                        }
                        local_168 = 1.0 / (dVar21 * dVar21);
                        pRVar4 = ref_grid->node->real;
                        printf("x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n"
                               ,SUB84((pRVar4[lVar12 * 0xf] + pRVar4[lVar13 * 0xf]) * 0.5,0));
                        local_120 = 0;
                        uStack_118 = 0;
                        local_110 = 0x3ff0000000000000;
                        local_158 = 0x3ff0000000000000;
                        local_130 = local_150 - local_140 * 0.0;
                        local_138 = local_140 * 0.0 - local_148;
                        local_128 = local_148 * 0.0 + local_150 * -0.0;
                        lVar12 = (long)(int)local_108;
                        dVar22 = (pRVar16[lVar12 * 6 + 5] * local_128 +
                                 local_138 * pRVar16[lVar12 * 6 + 2] +
                                 local_130 * pRVar16[lVar12 * 6 + 4]) * local_128 +
                                 (pRVar16[lVar12 * 6 + 2] * local_128 +
                                 pRVar16[lVar12 * 6] * local_138 +
                                 local_130 * pRVar16[lVar12 * 6 + 1]) * local_138 +
                                 (pRVar16[lVar12 * 6 + 4] * local_128 +
                                 pRVar16[lVar12 * 6 + 1] * local_138 +
                                 pRVar16[lVar12 * 6 + 3] * local_130) * local_130;
                        if (dVar22 < 0.0) {
                          dVar22 = sqrt(dVar22);
                        }
                        else {
                          dVar22 = SQRT(dVar22);
                        }
                        lVar12 = (long)local_108._4_4_;
                        dVar7 = (pRVar16[lVar12 * 6 + 5] * local_128 +
                                pRVar16[lVar12 * 6 + 2] * local_138 +
                                local_130 * pRVar16[lVar12 * 6 + 4]) * local_128 +
                                (pRVar16[lVar12 * 6 + 2] * local_128 +
                                pRVar16[lVar12 * 6] * local_138 +
                                pRVar16[lVar12 * 6 + 1] * local_130) * local_138 +
                                (pRVar16[lVar12 * 6 + 4] * local_128 +
                                pRVar16[lVar12 * 6 + 1] * local_138 +
                                pRVar16[lVar12 * 6 + 3] * local_130) * local_130;
                        if (dVar7 < 0.0) {
                          dVar7 = sqrt(dVar7);
                        }
                        else {
                          dVar7 = SQRT(dVar7);
                        }
                        dVar22 = 1.0 / ((dVar22 + dVar7) * 0.5);
                        local_160 = 1.0 / (dVar22 * dVar22);
                        uVar11 = ref_matrix_form_m(&local_168,local_68);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x44e,"ref_phys_yplus_metric",(ulong)uVar11,"form",dVar21);
                          local_1e8 = uVar11;
                          break;
                        }
                        uVar11 = ref_matrix_log_m(local_68,local_98);
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x44f,"ref_phys_yplus_metric",(ulong)uVar11,"form");
                          local_1e8 = uVar11;
                          break;
                        }
                        lVar12 = 0;
                        do {
                          vector_00[(long)(int)local_108 * 6 + lVar12] =
                               local_98[lVar12] + vector_00[(long)(int)local_108 * 6 + lVar12];
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != 6);
                        vector[(int)local_108] = vector[(int)local_108] + 1;
                        lVar12 = 0;
                        do {
                          vector_00[(long)local_108._4_4_ * 6 + lVar12] =
                               local_98[lVar12] + vector_00[(long)local_108._4_4_ * 6 + lVar12];
                          lVar12 = lVar12 + 1;
                        } while (lVar12 != 6);
                        vector[local_108._4_4_] = vector[local_108._4_4_] + 1;
                      }
                    }
                    cell = cell + 1;
                    bVar6 = cell < ref_cell->max;
                  } while (cell < ref_cell->max);
                }
                if (!bVar6) {
                  local_1e8 = ref_node_ghost_dbl(ref_node,vector_00,6);
                  if (local_1e8 == 0) {
                    local_1e8 = ref_node_ghost_int(ref_node,vector,1);
                    if (local_1e8 == 0) {
                      if (0 < ref_node->max) {
                        lVar12 = 0;
                        pRVar16 = vector_00;
                        do {
                          if ((-1 < ref_node->global[lVar12]) && (iVar8 = vector[lVar12], 0 < iVar8)
                             ) {
                            lVar13 = 0;
                            do {
                              pRVar16[lVar13] = pRVar16[lVar13] / (double)iVar8;
                              lVar13 = lVar13 + 1;
                            } while (lVar13 != 6);
                            vector[lVar12] = -1;
                            uVar11 = ref_matrix_exp_m(vector_00 + lVar12 * 6,local_1b0 + lVar12 * 6)
                            ;
                            if (uVar11 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x467,"ref_phys_yplus_metric",(ulong)uVar11,"form");
                              return uVar11;
                            }
                          }
                          lVar12 = lVar12 + 1;
                          pRVar16 = pRVar16 + 6;
                        } while (lVar12 < ref_node->max);
                      }
                      local_1e8 = ref_edge_create((REF_EDGE *)&local_108,ref_grid);
                      if (local_1e8 == 0) {
                        ref_edge = (REF_EDGE)CONCAT44(local_108._4_4_,(int)local_108);
                        if (0 < ref_edge->n) {
                          pRVar5 = ref_edge->e2n;
                          lVar12 = 0;
                          do {
                            iVar8 = pRVar5[lVar12 * 2];
                            lVar13 = (long)iVar8;
                            iVar2 = pRVar5[lVar12 * 2 + 1];
                            iVar3 = vector[lVar13];
                            if ((-1 < iVar3) && (vector[iVar2] == -1)) {
                              lVar18 = 0;
                              do {
                                vector_00[lVar13 * 6 + lVar18] =
                                     vector_00[iVar2 * 6 + lVar18] + vector_00[lVar13 * 6 + lVar18];
                                lVar18 = lVar18 + 1;
                              } while (lVar18 != 6);
                              vector[lVar13] = iVar3 + 1;
                            }
                            iVar3 = vector[iVar2];
                            if ((-1 < iVar3) && (vector[lVar13] == -1)) {
                              lVar13 = 0;
                              do {
                                vector_00[iVar2 * 6 + lVar13] =
                                     vector_00[iVar8 * 6 + lVar13] + vector_00[iVar2 * 6 + lVar13];
                                lVar13 = lVar13 + 1;
                              } while (lVar13 != 6);
                              vector[iVar2] = iVar3 + 1;
                            }
                            lVar12 = lVar12 + 1;
                          } while (lVar12 < ref_edge->n);
                        }
                        ref_edge_free(ref_edge);
                        local_1e8 = ref_node_ghost_dbl(ref_node,vector_00,6);
                        if (local_1e8 == 0) {
                          local_1e8 = ref_node_ghost_int(ref_node,vector,1);
                          if (local_1e8 == 0) {
                            if (0 < ref_node->max) {
                              lVar12 = 0;
                              pRVar16 = vector_00;
                              do {
                                if ((-1 < ref_node->global[lVar12]) &&
                                   (iVar8 = vector[lVar12], 0 < iVar8)) {
                                  lVar13 = 0;
                                  do {
                                    pRVar16[lVar13] = pRVar16[lVar13] / (double)iVar8;
                                    lVar13 = lVar13 + 1;
                                  } while (lVar13 != 6);
                                  vector[lVar12] = -2;
                                  uVar11 = ref_matrix_exp_m(vector_00 + lVar12 * 6,
                                                            local_1b0 + lVar12 * 6);
                                  if (uVar11 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                           ,0x48c,"ref_phys_yplus_metric",(ulong)uVar11,"form");
                                    return uVar11;
                                  }
                                }
                                lVar12 = lVar12 + 1;
                                pRVar16 = pRVar16 + 6;
                              } while (lVar12 < ref_node->max);
                            }
                            local_1e8 = ref_node_ghost_dbl(ref_node,local_1b0,6);
                            if (local_1e8 == 0) {
                              if (local_1c0 != (REF_DBL *)0x0) {
                                free(local_1c0);
                              }
                              if (local_1d8 != (REF_DBL *)0x0) {
                                free(local_1d8);
                              }
                              if (vector_00 != (REF_DBL *)0x0) {
                                free(vector_00);
                              }
                              if (vector != (REF_INT *)0x0) {
                                free(vector);
                              }
                              local_1e8 = 0;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x490,"ref_phys_yplus_metric",(ulong)local_1e8,"ghost metric")
                              ;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x483,"ref_phys_yplus_metric",(ulong)local_1e8,"ghost hits");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x482,"ref_phys_yplus_metric",(ulong)local_1e8,"ghost metric");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x46e,"ref_phys_yplus_metric",(ulong)local_1e8,"orig edges");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x45e,"ref_phys_yplus_metric",(ulong)local_1e8,"ghost hits");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x45d,"ref_phys_yplus_metric",(ulong)local_1e8,"ghost metric");
                  }
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x417,"ref_phys_yplus_metric",(ulong)local_1e8,"length scale");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x414,"ref_phys_yplus_metric",(ulong)local_1e8,"length scale");
          }
        }
      }
    }
  }
  return local_1e8;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric(REF_GRID ref_grid, REF_DBL *metric,
                                         REF_DBL mach, REF_DBL re,
                                         REF_DBL temperature, REF_DBL target,
                                         REF_INT ldim, REF_DBL *field,
                                         REF_DICT ref_dict_bcs,
                                         REF_BOOL sample_viscous_length_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *lengthscale2, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale2, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  RSS(ref_phys_yplus_lengthscale2(ref_grid, mach, re, temperature, ldim, field,
                                  lengthscale2),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], mh, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    REF_DBL err1 = 0.10, err2 = 0.20;
    REF_DBL l1, l2, s1, s2, diff;
    REF_DBL equilateral_altitude =
        0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;
      l1 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);
      l2 = 0.5 * (lengthscale2[edg_nodes[0]] + lengthscale2[edg_nodes[1]]);
      diff = ABS(l2 - l1) / l1;
      s2 = MIN(MAX(diff - err1, 0.0) / (err2 - err1), 1.0);
      s1 = 1.0 - s2;
      h0 = (s1 * target * l1 / equilateral_altitude + s2 * mh);
      if (!sample_viscous_length_error) {
        h0 = target * l1 / equilateral_altitude;
      }
      ref_matrix_eig(d, 0) = 1.0 / (h0 * h0);

      printf(
          "x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n",
          0.5 * (ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[0]) +
                 ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[1])),
          l1, l2, diff, s1, s2, target * l1 / equilateral_altitude, mh, h0);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale2);
  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}